

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void VW::finish_example(vw *all,example *ec)

{
  bool bVar1;
  mutex *__mutex;
  
  bVar1 = is_ring_example(all,ec);
  if (bVar1) {
    clean_example(all,ec,false);
    __mutex = &all->p->output_lock;
    std::mutex::lock(__mutex);
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  return;
}

Assistant:

void finish_example(vw& all, example& ec)
{
  // only return examples to the pool that are from the pool and not externally allocated
  if (!is_ring_example(all, &ec))
    return;

  clean_example(all, ec, false);

  {
    std::lock_guard<std::mutex> lock(all.p->output_lock);
    all.p->output_done.notify_one();
  }
}